

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

ImageChannelValues * __thiscall
pbrt::Image::MRSE(ImageChannelValues *__return_storage_ptr__,Image *this,ImageChannelDesc *desc,
                 Image *ref,Image *mrseImage)

{
  float fVar1;
  size_t sVar2;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar3;
  float fVar4;
  Image *pIVar5;
  ImageChannelDesc *pIVar6;
  int iVar7;
  Allocator alloc;
  ulong uVar8;
  ulong uVar9;
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pIVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar12;
  long lVar13;
  ulong uVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first;
  size_t sVar15;
  Point2i PVar16;
  Tuple2<pbrt::Point2,_int> TVar17;
  ulong uVar18;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  allocator_type local_201;
  Image *local_200;
  long local_1f8;
  ImageChannelDesc *local_1f0;
  Point2i vb;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  Image *local_1b8;
  vector<double,_std::allocator<double>_> sumRSE;
  ImageChannelDesc refDesc;
  ColorEncodingHandle local_150;
  Point2i va;
  int local_140;
  undefined4 uStack_13c;
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  ColorEncodingHandle local_98;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> local_90;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> local_70;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_50;
  
  va.super_Tuple2<pbrt::Point2,_int>.x = 0;
  va.super_Tuple2<pbrt::Point2,_int>.y = 0;
  std::vector<double,_std::allocator<double>_>::vector
            (&sumRSE,(desc->offset).nStored,(value_type_conflict4 *)&va,(allocator_type *)&refDesc);
  local_1f0 = desc;
  ChannelNames_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&va,this,desc);
  requestedChannels.n =
       CONCAT44(uStack_13c,local_140) - (long)va.super_Tuple2<pbrt::Point2,_int> >> 5;
  requestedChannels.ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       va.super_Tuple2<pbrt::Point2,_int>;
  GetChannelDesc(&refDesc,ref,requestedChannels);
  local_200 = mrseImage;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&va);
  if (refDesc.offset.nStored == 0) {
    LogFatal<char_const(&)[14]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.cpp"
               ,0x266,"Check failed: %s",(char (*) [14])"(bool)refDesc");
  }
  TVar17 = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
  vb.super_Tuple2<pbrt::Point2,_int> = (ref->resolution).super_Tuple2<pbrt::Point2,_int>;
  va.super_Tuple2<pbrt::Point2,_int> = TVar17;
  if ((TVar17.x == vb.super_Tuple2<pbrt::Point2,_int>.x) &&
     (iVar7 = TVar17.y, iVar7 == vb.super_Tuple2<pbrt::Point2,_int>.y)) {
    local_1b8 = this;
    if (local_200 != (Image *)0x0) {
      pbVar11 = (this->channelNames).ptr;
      __first = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &(this->channelNames).field_2;
      if (pbVar11 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        __first = pbVar11;
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      vector<std::__cxx11::string_const*,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vb,__first,
                 __first + (this->channelNames).nStored,&local_201);
      PVar16.super_Tuple2<pbrt::Point2,_int> = vb.super_Tuple2<pbrt::Point2,_int>;
      local_150.
      super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
      .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               )0;
      lVar13 = (long)local_1e0 - (long)vb.super_Tuple2<pbrt::Point2,_int>;
      alloc.memoryResource = pstd::pmr::new_delete_resource();
      channels.n = lVar13 >> 5;
      channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     PVar16.super_Tuple2<pbrt::Point2,_int>;
      Image((Image *)&va,Float,(Point2i)TVar17,channels,&local_150,alloc);
      pIVar5 = local_200;
      (local_200->resolution).super_Tuple2<pbrt::Point2,_int>.y = local_140;
      local_200->format = va.super_Tuple2<pbrt::Point2,_int>.x;
      (local_200->resolution).super_Tuple2<pbrt::Point2,_int>.x =
           va.super_Tuple2<pbrt::Point2,_int>.y;
      InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&local_200->channelNames,&local_138);
      (pIVar5->encoding).
      super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
      .bits = (uintptr_t)
              local_98.
              super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
              .bits;
      pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
                (&pIVar5->p8,&local_90);
      pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
                (&pIVar5->p16,&local_70);
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                (&pIVar5->p32,&local_50);
      local_50.nStored = 0;
      (*(local_50.alloc.memoryResource)->_vptr_memory_resource[3])
                (local_50.alloc.memoryResource,local_50.ptr,local_50.nAlloc << 2,4);
      local_70.nStored = 0;
      (*(local_70.alloc.memoryResource)->_vptr_memory_resource[3])
                (local_70.alloc.memoryResource,local_70.ptr,local_70.nAlloc * 2,2);
      this = local_1b8;
      local_90.nStored = 0;
      (*(local_90.alloc.memoryResource)->_vptr_memory_resource[3])
                (local_90.alloc.memoryResource,local_90.ptr,local_90.nAlloc,1);
      InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~InlinedVector(&local_138);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&vb);
      TVar17 = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
      iVar7 = TVar17.y;
    }
    if (0 < iVar7) {
      local_1f8 = 0;
      do {
        if (0 < TVar17.x) {
          uVar18 = 0;
          uVar8 = local_1f8 << 0x20;
          do {
            pIVar6 = local_1f0;
            PVar16.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(uVar8 | uVar18);
            GetChannels((ImageChannelValues *)&va,this,PVar16,local_1f0,(WrapMode2D)0x200000002);
            GetChannels((ImageChannelValues *)&vb,ref,PVar16,&refDesc,(WrapMode2D)0x200000002);
            uVar9 = (pIVar6->offset).nStored;
            if (uVar9 != 0) {
              uVar14 = 0;
              do {
                pIVar10 = (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)CONCAT44(uStack_13c,local_140);
                if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT44(uStack_13c,local_140) ==
                    (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)0x0) {
                  pIVar10 = &local_138;
                }
                pbVar11 = local_1e0;
                if (local_1e0 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pbVar11 = &local_1d8;
                }
                fVar1 = *(float *)((long)&(pbVar11->_M_dataplus)._M_p + uVar14 * 4);
                fVar4 = *(float *)((long)&(pIVar10->alloc).memoryResource + uVar14 * 4) - fVar1;
                fVar1 = fVar1 + 0.01;
                fVar1 = (fVar4 * fVar4) / (fVar1 * fVar1);
                if ((ABS(fVar1) != INFINITY) &&
                   (sumRSE.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar14] =
                         (double)fVar1 +
                         sumRSE.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar14], local_200 != (Image *)0x0)) {
                  SetChannel(local_200,PVar16,(int)uVar14,fVar1);
                  uVar9 = (local_1f0->offset).nStored;
                }
                uVar14 = uVar14 + 1;
              } while (uVar14 < uVar9);
            }
            local_1d8.field_2._8_8_ = 0;
            (**(code **)(*(long *)vb.super_Tuple2<pbrt::Point2,_int> + 0x18))
                      (vb.super_Tuple2<pbrt::Point2,_int>,local_1e0,
                       local_1d8.field_2._M_allocated_capacity << 2,4);
            local_138.field_2.fixed[0]._M_string_length = 0;
            (**(code **)(*(long *)va.super_Tuple2<pbrt::Point2,_int> + 0x18))
                      (va.super_Tuple2<pbrt::Point2,_int>,CONCAT44(uStack_13c,local_140),
                       (long)local_138.field_2.fixed[0]._M_dataplus._M_p << 2,4);
            uVar18 = uVar18 + 1;
            TVar17 = (local_1b8->resolution).super_Tuple2<pbrt::Point2,_int>;
            this = local_1b8;
          } while ((long)uVar18 < (long)TVar17.x);
        }
        local_1f8 = local_1f8 + 1;
      } while (local_1f8 < (long)TVar17 >> 0x20);
    }
    pIVar6 = local_1f0;
    sVar2 = (local_1f0->offset).nStored;
    vb.super_Tuple2<pbrt::Point2,_int> = vb.super_Tuple2<pbrt::Point2,_int> & 0xffffffff00000000;
    va.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)pstd::pmr::new_delete_resource()
    ;
    InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::InlinedVector
              (&__return_storage_ptr__->
                super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>,sVar2,
               (float *)&vb,(polymorphic_allocator<float> *)&va);
    sVar2 = (pIVar6->offset).nStored;
    if (sVar2 != 0) {
      paVar3 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                *)(__return_storage_ptr__->
                  super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).ptr;
      paVar12 = &(__return_storage_ptr__->
                 super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>).field_2;
      if (paVar3 != (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                     *)0x0) {
        paVar12 = paVar3;
      }
      sVar15 = 0;
      do {
        TVar17 = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
        paVar12->fixed[sVar15] =
             (float)(sumRSE.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[sVar15] / (double)(TVar17.y * TVar17.x));
        sVar15 = sVar15 + 1;
      } while (sVar2 != sVar15);
    }
    refDesc.offset.nStored = 0;
    (*(refDesc.offset.alloc.memoryResource)->_vptr_memory_resource[3])
              (refDesc.offset.alloc.memoryResource,refDesc.offset.ptr,refDesc.offset.nAlloc << 2,4);
    if (sumRSE.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(sumRSE.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)sumRSE.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)sumRSE.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  LogFatal<char_const(&)[13],char_const(&)[17],char_const(&)[13],pbrt::Point2<int>&,char_const(&)[17],pbrt::Point2<int>&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image.cpp"
             ,0x267,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [13])0x4b9f22,
             (char (*) [17])"ref.Resolution()",(char (*) [13])0x4b9f22,(Point2<int> *)&va,
             (char (*) [17])"ref.Resolution()",&vb);
}

Assistant:

ImageChannelValues Image::MRSE(const ImageChannelDesc &desc, const Image &ref,
                               Image *mrseImage) const {
    std::vector<double> sumRSE(desc.size(), 0.);

    ImageChannelDesc refDesc = ref.GetChannelDesc(ChannelNames(desc));
    CHECK((bool)refDesc);
    CHECK_EQ(Resolution(), ref.Resolution());

    if (mrseImage)
        *mrseImage = Image(PixelFormat::Float, Resolution(), ChannelNames());

    for (int y = 0; y < Resolution().y; ++y)
        for (int x = 0; x < Resolution().x; ++x) {
            ImageChannelValues v = GetChannels({x, y}, desc);
            ImageChannelValues vref = ref.GetChannels({x, y}, refDesc);

            for (int c = 0; c < desc.size(); ++c) {
                Float rse = Sqr(v[c] - vref[c]) / Sqr(vref[c] + 0.01);
                if (std::isinf(rse))
                    continue;
                sumRSE[c] += rse;
                if (mrseImage)
                    mrseImage->SetChannel({x, y}, c, rse);
            }
        }

    ImageChannelValues mrse(desc.size());
    for (int c = 0; c < desc.size(); ++c)
        mrse[c] = sumRSE[c] / (Resolution().x * Resolution().y);
    return mrse;
}